

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

void __thiscall
duckdb::ParquetReader::InitializeScan
          (ParquetReader *this,ClientContext *context,ParquetReaderScanState *state,
          vector<unsigned_long,_true> *groups_to_read)

{
  unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>,_true> *this_00;
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
  *this_02;
  _Head_base<0UL,_duckdb::CachingFileHandle_*,_false> _Var3;
  _Head_base<0UL,_duckdb::AdaptiveFilter_*,_false> __ptr;
  pointer pPVar4;
  pointer pPVar5;
  _Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_> __ptr_00;
  TProtocol *pTVar6;
  _Head_base<0UL,_duckdb::ColumnReader_*,_false> _Var7;
  FileSystem *pFVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  pointer pCVar13;
  type table_filters;
  _Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_> this_03;
  pointer pTVar14;
  type __args_2;
  _Base_ptr p_Var15;
  type file_handle;
  long lVar16;
  pointer __p;
  pointer this_04;
  _Rb_tree_header *p_Var17;
  bool bVar18;
  FileOpenFlags flags;
  Value disable_prefetch;
  Value prefetch_all_files;
  CachingFileSystem local_150;
  string local_140;
  undefined8 local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_118;
  string local_110;
  undefined1 local_f0 [72];
  pointer local_a8;
  string local_90;
  Value local_70;
  
  state->current_group = -1;
  state->finished = false;
  state->offset_in_group = 0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)state,groups_to_read);
  SelectionVector::Initialize(&state->sel,0x800);
  local_150.external_file_cache = (ExternalFileCache *)&state->file_handle;
  _Var3._M_head_impl =
       (state->file_handle).
       super_unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::CachingFileHandle_*,_std::default_delete<duckdb::CachingFileHandle>_>
       .super__Head_base<0UL,_duckdb::CachingFileHandle_*,_false>._M_head_impl;
  bVar18 = true;
  if (_Var3._M_head_impl != (CachingFileHandle *)0x0) {
    pCVar13 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              ::operator->((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                            *)local_150.external_file_cache);
    CachingFileHandle::GetPath_abi_cxx11_((string *)(local_f0 + 0x40),pCVar13);
    pCVar13 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              ::operator->(&this->file_handle);
    CachingFileHandle::GetPath_abi_cxx11_(&local_90,pCVar13);
    if (local_a8 == (pointer)local_90._M_string_length) {
      if (local_a8 == (pointer)0x0) {
        bVar18 = false;
      }
      else {
        iVar12 = bcmp((void *)local_f0._64_8_,local_90._M_dataplus._M_p,(size_t)local_a8);
        bVar18 = iVar12 != 0;
      }
    }
  }
  if (_Var3._M_head_impl != (CachingFileHandle *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((pointer)local_f0._64_8_ != (pointer)&stack0xffffffffffffff60) {
      operator_delete((void *)local_f0._64_8_);
    }
  }
  if (bVar18) {
    Value::Value((Value *)local_f0,0);
    Value::Value(&local_70,0);
    paVar1 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"disable_parquet_prefetching","");
    ClientContext::TryGetCurrentSetting(context,&local_140,(Value *)local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    local_140._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"prefetch_all_parquet_files","");
    ClientContext::TryGetCurrentSetting(context,&local_140,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    this_02 = &this->file_handle;
    pCVar13 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              ::operator->(this_02);
    bVar18 = CachingFileHandle::OnDiskFile(pCVar13);
    bVar10 = true;
    if (bVar18) {
      bVar10 = Value::GetValue<bool>(&local_70);
    }
    pCVar13 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              ::operator->(this_02);
    bVar18 = CachingFileHandle::CanSeek(pCVar13);
    bVar11 = true;
    if (bVar18) {
      bVar11 = Value::GetValue<bool>((Value *)local_f0);
    }
    if ((bVar11 == false) && (bVar10 == true)) {
      state->prefetch_mode = true;
      pCVar13 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                ::operator->(this_02);
      bVar18 = CachingFileHandle::IsRemoteFile(pCVar13);
      lVar16 = (ulong)bVar18 * 4 + 1;
    }
    else {
      state->prefetch_mode = false;
      lVar16 = 1;
    }
    pCVar13 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              ::operator->(this_02);
    CachingFileHandle::GetPath_abi_cxx11_(&local_110,pCVar13);
    paVar2 = &local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == paVar2) {
      local_140.field_2._8_8_ = local_110.field_2._8_8_;
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140._M_dataplus._M_p = local_110._M_dataplus._M_p;
    }
    local_140._M_string_length = local_110._M_string_length;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_120 = 0;
    p_Stack_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    flags.lock = (char)lVar16;
    flags.compression = (char)((ulong)lVar16 >> 8);
    flags._10_6_ = (int6)((ulong)lVar16 >> 0x10);
    flags.flags = (idx_t)&local_140;
    local_110._M_dataplus._M_p = (pointer)paVar2;
    CachingFileSystem::OpenFile(&local_150,(OpenFileInfo *)&this->fs,flags);
    pFVar8 = local_150.file_system;
    local_150.file_system = (FileSystem *)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>::
    reset((__uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
           *)local_150.external_file_cache,(pointer)pFVar8);
    pFVar8 = local_150.file_system;
    if ((CachingFileHandle *)local_150.file_system != (CachingFileHandle *)0x0) {
      CachingFileHandle::~CachingFileHandle((CachingFileHandle *)local_150.file_system);
      operator_delete(pFVar8);
    }
    local_150.file_system = (FileSystem *)0x0;
    if (p_Stack_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_118);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    Value::~Value(&local_70);
    Value::~Value((Value *)local_f0);
  }
  this_00 = &state->adaptive_filter;
  __ptr._M_head_impl =
       (state->adaptive_filter).
       super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
       super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
       .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
  (state->adaptive_filter).
  super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
  super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>.
  super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl = (AdaptiveFilter *)0x0;
  if (__ptr._M_head_impl != (AdaptiveFilter *)0x0) {
    ::std::default_delete<duckdb::AdaptiveFilter>::operator()
              ((default_delete<duckdb::AdaptiveFilter> *)this_00,__ptr._M_head_impl);
  }
  pPVar4 = (state->scan_filters).
           super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>.
           super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (state->scan_filters).
           super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>.
           super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_04 = pPVar4;
  if (pPVar5 != pPVar4) {
    do {
      ParquetScanFilter::~ParquetScanFilter(this_04);
      this_04 = this_04 + 1;
    } while (this_04 != pPVar5);
    (state->scan_filters).
    super_vector<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>.
    super__Vector_base<duckdb::ParquetScanFilter,_std::allocator<duckdb::ParquetScanFilter>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar4;
  }
  if ((this->super_BaseFileReader).filters.
      super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
      .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl != (TableFilterSet *)0x0)
  {
    this_01 = &(this->super_BaseFileReader).filters;
    table_filters =
         unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::
         operator*(this_01);
    this_03.super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>)operator_new(0xa8);
    AdaptiveFilter::AdaptiveFilter
              ((AdaptiveFilter *)
               this_03.super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl,
               table_filters);
    local_f0._0_8_ = (AdaptiveFilter *)0x0;
    __ptr_00.super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>
         .super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>;
    (this_00->super_unique_ptr<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::AdaptiveFilter,_std::default_delete<duckdb::AdaptiveFilter>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::AdaptiveFilter_*,_std::default_delete<duckdb::AdaptiveFilter>_>.
    super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false> =
         this_03.super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl;
    if (__ptr_00.super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl !=
        (AdaptiveFilter *)0x0) {
      ::std::default_delete<duckdb::AdaptiveFilter>::operator()
                ((default_delete<duckdb::AdaptiveFilter> *)this_00,
                 (AdaptiveFilter *)
                 __ptr_00.super__Head_base<0UL,_duckdb::AdaptiveFilter_*,_false>._M_head_impl);
    }
    if ((AdaptiveFilter *)local_f0._0_8_ != (AdaptiveFilter *)0x0) {
      ::std::default_delete<duckdb::AdaptiveFilter>::operator()
                ((default_delete<duckdb::AdaptiveFilter> *)local_f0,(AdaptiveFilter *)local_f0._0_8_
                );
    }
    pTVar14 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
              ::operator->(this_01);
    p_Var15 = (pTVar14->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var17 = &(pTVar14->filters)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var15 != p_Var17) {
      do {
        __args_2 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                   operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                              *)&p_Var15[1]._M_parent);
        ::std::vector<duckdb::ParquetScanFilter,std::allocator<duckdb::ParquetScanFilter>>::
        emplace_back<duckdb::ClientContext&,unsigned_long_const&,duckdb::TableFilter&>
                  ((vector<duckdb::ParquetScanFilter,std::allocator<duckdb::ParquetScanFilter>> *)
                   &state->scan_filters,context,(unsigned_long *)(p_Var15 + 1),__args_2);
        p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15);
      } while ((_Rb_tree_header *)p_Var15 != p_Var17);
    }
  }
  file_handle = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                ::operator*((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                             *)local_150.external_file_cache);
  CreateThriftFileProtocol((duckdb *)local_f0,file_handle,state->prefetch_mode);
  uVar9 = local_f0._0_8_;
  local_f0._0_8_ = (ColumnReader *)0x0;
  pTVar6 = (state->thrift_file_proto)._M_t.
           super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
           .super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>._M_head_impl;
  (state->thrift_file_proto)._M_t.
  super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
  .super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>._M_head_impl =
       (TProtocol *)uVar9;
  if (pTVar6 != (TProtocol *)0x0) {
    (*pTVar6->_vptr_TProtocol[1])();
  }
  CreateReader((ParquetReader *)local_f0,(ClientContext *)this);
  uVar9 = local_f0._0_8_;
  local_f0._0_8_ = (_func_int **)0x0;
  _Var7._M_head_impl =
       (state->root_reader).
       super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
       super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
       super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
  (state->root_reader).
  super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
  super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = (ColumnReader *)uVar9;
  if (_Var7._M_head_impl != (ColumnReader *)0x0) {
    (**(code **)((long)(_Var7._M_head_impl)->_vptr_ColumnReader + 8))();
  }
  if ((_func_int **)local_f0._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_f0._0_8_ + 8))();
  }
  ResizeableBuffer::resize(&state->define_buf,this->allocator,0x800);
  ResizeableBuffer::resize(&state->repeat_buf,this->allocator,0x800);
  return;
}

Assistant:

void ParquetReader::InitializeScan(ClientContext &context, ParquetReaderScanState &state,
                                   vector<idx_t> groups_to_read) {
	state.current_group = -1;
	state.finished = false;
	state.offset_in_group = 0;
	state.group_idx_list = std::move(groups_to_read);
	state.sel.Initialize(STANDARD_VECTOR_SIZE);
	if (!state.file_handle || state.file_handle->GetPath() != file_handle->GetPath()) {
		auto flags = FileFlags::FILE_FLAGS_READ;

		Value disable_prefetch = false;
		Value prefetch_all_files =
#ifdef DUCKDB_PREFETCH_ALL_PARQUET_FILES
		    true; // For debugging purposes we can toggle this to always enable
#else
		    false; // Defaults to false
#endif
		context.TryGetCurrentSetting("disable_parquet_prefetching", disable_prefetch);
		context.TryGetCurrentSetting("prefetch_all_parquet_files", prefetch_all_files);
		bool should_prefetch = !file_handle->OnDiskFile() || prefetch_all_files.GetValue<bool>();
		bool can_prefetch = file_handle->CanSeek() && !disable_prefetch.GetValue<bool>();

		if (should_prefetch && can_prefetch) {
			state.prefetch_mode = true;
			if (file_handle->IsRemoteFile()) {
				flags |= FileFlags::FILE_FLAGS_DIRECT_IO;
			}
		} else {
			state.prefetch_mode = false;
		}

		state.file_handle = fs.OpenFile(file_handle->GetPath(), flags);
	}
	state.adaptive_filter.reset();
	state.scan_filters.clear();
	if (filters) {
		state.adaptive_filter = make_uniq<AdaptiveFilter>(*filters);
		for (auto &entry : filters->filters) {
			state.scan_filters.emplace_back(context, entry.first, *entry.second);
		}
	}

	state.thrift_file_proto = CreateThriftFileProtocol(*state.file_handle, state.prefetch_mode);
	state.root_reader = CreateReader(context);
	state.define_buf.resize(allocator, STANDARD_VECTOR_SIZE);
	state.repeat_buf.resize(allocator, STANDARD_VECTOR_SIZE);
}